

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::printInfo(FastText *this,real progress,real loss,ostream *log_stream)

{
  double dVar1;
  _Setprecision _Var2;
  _Setw _Var3;
  element_type *peVar4;
  __int_type _Var5;
  ostream *poVar6;
  ostream *in_RSI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  double dVar7;
  int32_t etam;
  int32_t etah;
  int64_t eta;
  double wst;
  double lr;
  double t;
  time_point end;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff28;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff30;
  __atomic_base<long> *in_stack_ffffffffffffff38;
  long local_50;
  double local_48;
  duration<double,_std::ratio<1L,_1L>_> local_30;
  double local_28;
  undefined8 local_20;
  ostream *local_18;
  float local_10;
  float local_c;
  
  local_18 = in_RSI;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  local_20 = std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_30.__r = (rep_conflict)
                 std::chrono::
                 duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                           (in_stack_ffffffffffffff28);
  local_28 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_30);
  peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16fbb7);
  dVar1 = peVar4->lr;
  dVar7 = (double)local_c;
  local_48 = 0.0;
  local_50 = 0x278d00;
  if ((0.0 < local_c) && (0.0 <= local_28)) {
    local_c = local_c * 100.0;
    local_50 = (long)((local_28 * (double)(100.0 - local_c)) / (double)local_c);
    _Var5 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffff38);
    local_48 = (double)_Var5 / local_28;
    peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16fcaf);
    local_48 = local_48 / (double)peVar4->thread;
  }
  std::ostream::operator<<(local_18,std::fixed);
  std::operator<<(local_18,"Progress: ");
  poVar6 = local_18;
  _Var2 = std::setprecision(1);
  poVar6 = std::operator<<(poVar6,_Var2);
  _Var3 = std::setw(5);
  poVar6 = std::operator<<(poVar6,_Var3);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_c);
  std::operator<<(poVar6,"%");
  poVar6 = std::operator<<(local_18," words/sec/thread: ");
  _Var3 = std::setw(7);
  poVar6 = std::operator<<(poVar6,_Var3);
  std::ostream::operator<<(poVar6,(long)local_48);
  poVar6 = std::operator<<(local_18," lr: ");
  _Var3 = std::setw(9);
  poVar6 = std::operator<<(poVar6,_Var3);
  _Var2 = std::setprecision(6);
  poVar6 = std::operator<<(poVar6,_Var2);
  std::ostream::operator<<(poVar6,dVar1 * (1.0 - dVar7));
  poVar6 = std::operator<<(local_18," loss: ");
  _Var3 = std::setw(9);
  poVar6 = std::operator<<(poVar6,_Var3);
  _Var2 = std::setprecision(6);
  poVar6 = std::operator<<(poVar6,_Var2);
  std::ostream::operator<<(poVar6,local_10);
  poVar6 = std::operator<<(local_18," ETA: ");
  _Var3 = std::setw(3);
  poVar6 = std::operator<<(poVar6,_Var3);
  std::ostream::operator<<(poVar6,(int)(local_50 / 0xe10));
  poVar6 = std::operator<<(local_18,"h");
  _Var3 = std::setw(2);
  poVar6 = std::operator<<(poVar6,_Var3);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)((local_50 % 0xe10) / 0x3c));
  std::operator<<(poVar6,"m");
  std::ostream::operator<<(local_18,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void FastText::printInfo(real progress, real loss, std::ostream& log_stream) {
  std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();
  double t =
      std::chrono::duration_cast<std::chrono::duration<double>>(end - start_)
          .count();
  double lr = args_->lr * (1.0 - progress);
  double wst = 0;

  int64_t eta = 2592000; // Default to one month in seconds (720 * 3600)

  if (progress > 0 && t >= 0) {
    progress = progress * 100;
    eta = t * (100 - progress) / progress;
    wst = double(tokenCount_) / t / args_->thread;
  }
  int32_t etah = eta / 3600;
  int32_t etam = (eta % 3600) / 60;

  log_stream << std::fixed;
  log_stream << "Progress: ";
  log_stream << std::setprecision(1) << std::setw(5) << progress << "%";
  log_stream << " words/sec/thread: " << std::setw(7) << int64_t(wst);
  log_stream << " lr: " << std::setw(9) << std::setprecision(6) << lr;
  log_stream << " loss: " << std::setw(9) << std::setprecision(6) << loss;
  log_stream << " ETA: " << std::setw(3) << etah;
  log_stream << "h" << std::setw(2) << etam << "m";
  log_stream << std::flush;
}